

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O1

int __thiscall LPCMStreamReader::decodeWaveHeader(LPCMStreamReader *this,uint8_t *buff,uint8_t *end)

{
  LPCMHeaderType LVar1;
  int iVar2;
  uint uVar3;
  short *psVar4;
  bool bVar5;
  ushort uVar6;
  short *buff_00;
  undefined4 *puVar7;
  ostream *poVar8;
  byte bVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  bool *pbVar13;
  short *psVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  ostringstream ss;
  uint *local_268;
  undefined8 local_260;
  uint local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  uint *local_248;
  undefined8 local_240;
  uint local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  uint *local_228;
  undefined8 local_220;
  uint local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  iVar10 = -10;
  if ((long)end - (long)buff < 0x14) {
    return -10;
  }
  LVar1 = this->m_headerType;
  buff_00 = (short *)findSubstr(anon_var_dwarf_13d159 + 0xc,buff,end);
  if (LVar1 == htWAVE64) {
    if ((buff_00 != (short *)0x0) && (psVar14 = buff_00 + 0xc, psVar14 < end)) {
      uVar17 = *(ulong *)(buff_00 + 8);
      puVar11 = (uint8_t *)((long)buff_00 + uVar17);
      psVar4 = buff_00;
      goto joined_r0x00194217;
    }
LAB_001943a0:
    bVar5 = false;
    goto LAB_001943a2;
  }
  if ((buff_00 == (short *)0x0) || (psVar14 = buff_00 + 4, end <= psVar14)) goto LAB_001943a0;
  uVar17 = (ulong)*(uint *)(buff_00 + 2);
  puVar11 = (uint8_t *)((long)psVar14 + uVar17);
  psVar4 = psVar14;
joined_r0x00194217:
  if (end <= puVar11) goto LAB_001943a0;
  uVar6 = psVar14[1];
  bVar9 = (byte)uVar6;
  this->m_channels = bVar9;
  uVar6 = uVar6 & 0xff;
  if (8 < uVar6) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Too many channels: ",0x13);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(uint)this->m_channels);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,". Maximum supported value is 8(7.1)",0x23);
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_1c8 == &local_1b8) {
      puVar7[6] = local_1b8;
      puVar7[7] = uStack_1b4;
      puVar7[8] = uStack_1b0;
      puVar7[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar7 + 2) = local_1c8;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar7 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (uVar6 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Invalid channels count: 0. WAVE header is invalid.",0x32);
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_1e8 == &local_1d8) {
      puVar7[6] = local_1d8;
      puVar7[7] = uStack_1d4;
      puVar7[8] = uStack_1d0;
      puVar7[9] = uStack_1cc;
    }
    else {
      *(uint **)(puVar7 + 2) = local_1e8;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1d4,local_1d8);
    }
    *(undefined8 *)(puVar7 + 4) = local_1e0;
    local_1e0 = 0;
    local_1d8 = local_1d8 & 0xffffff00;
    local_1e8 = &local_1d8;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar2 = *(int *)(psVar14 + 2);
  this->m_freq = iVar2;
  if (((iVar2 != 48000) && (iVar2 != 96000)) && (iVar2 != 0x2ee00)) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Sample rate ",0xc);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->m_freq);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," is not supported for LPCM format. Allowed values: 48000, 96000, 192000",0x47
              );
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_208 == &local_1f8) {
      puVar7[6] = local_1f8;
      puVar7[7] = uStack_1f4;
      puVar7[8] = uStack_1f0;
      puVar7[9] = uStack_1ec;
    }
    else {
      *(uint **)(puVar7 + 2) = local_208;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1f4,local_1f8);
    }
    *(undefined8 *)(puVar7 + 4) = local_200;
    local_200 = 0;
    local_1f8 = local_1f8 & 0xffffff00;
    local_208 = &local_1f8;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  uVar6 = psVar14[7];
  this->m_bitsPerSample = uVar6;
  if ((0x18 < uVar6) || ((0x1110000U >> (uVar6 & 0x1f) & 1) == 0)) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Bit depth ",10);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," is not supported for LPCM format. Allowed values: 16bit, 20bit, 24bit",0x46)
    ;
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar7 = 3;
    *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
    if (local_228 == &local_218) {
      puVar7[6] = local_218;
      puVar7[7] = uStack_214;
      puVar7[8] = uStack_210;
      puVar7[9] = uStack_20c;
    }
    else {
      *(uint **)(puVar7 + 2) = local_228;
      *(ulong *)(puVar7 + 6) = CONCAT44(uStack_214,local_218);
    }
    *(undefined8 *)(puVar7 + 4) = local_220;
    local_220 = 0;
    local_218 = local_218 & 0xffffff00;
    local_228 = &local_218;
    __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  pbVar13 = &this->m_lfeExists;
  this->m_lfeExists = false;
  if (*psVar14 != 1) {
    if (*psVar14 != -2) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unsupported WAVE format. wFormatTag: ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar7 = 3;
      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
      if (local_268 == &local_258) {
        puVar7[6] = local_258;
        puVar7[7] = uStack_254;
        puVar7[8] = uStack_250;
        puVar7[9] = uStack_24c;
      }
      else {
        *(uint **)(puVar7 + 2) = local_268;
        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_254,local_258);
      }
      *(undefined8 *)(puVar7 + 4) = local_260;
      local_258 = local_258 & 0xffffff00;
      __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if (psVar14[9] != 0) {
      this->m_bitsPerSample = psVar14[9];
    }
    *pbVar13 = (bool)(*(byte *)(psVar14 + 10) >> 3 & 1);
    bVar5 = wave_format::GUID::operator==
                      ((GUID *)(psVar14 + 0xc),(GUID *)wave_format::KSDATAFORMAT_SUBTYPE_PCM);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unsupported WAVE format. Only PCM audio is supported.",0x35);
      puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar7 = 3;
      *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
      if (local_248 == &local_238) {
        puVar7[6] = local_238;
        puVar7[7] = uStack_234;
        puVar7[8] = uStack_230;
        puVar7[9] = uStack_22c;
      }
      else {
        *(uint **)(puVar7 + 2) = local_248;
        *(ulong *)(puVar7 + 6) = CONCAT44(uStack_234,local_238);
      }
      *(undefined8 *)(puVar7 + 4) = local_240;
      local_240 = 0;
      local_238 = local_238 & 0xffffff00;
      local_248 = &local_238;
      __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    goto switchD_001944a3_default;
  }
  if (bVar9 < 3) goto switchD_001944a3_default;
  switch(bVar9) {
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ",0x2d);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.
                        m_streamIndex);
    pcVar16 = " do not contain channels configuration info. Applying default value: L R LFE";
    lVar15 = 0x4c;
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ",0x2d);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.
                        m_streamIndex);
    pcVar16 = " do not contain channels configuration info. Applying default value: L R BL BR";
    lVar15 = 0x4e;
    goto LAB_001945c7;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ",0x2d);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.
                        m_streamIndex);
    pcVar16 = " do not contain channels configuration info. Applying default value: L R C BL BR";
    lVar15 = 0x50;
    goto LAB_001945c7;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ",0x2d);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.
                        m_streamIndex);
    pcVar16 = " do not contain channels configuration info. Applying default value: L R C LFE BL BR"
    ;
    lVar15 = 0x54;
    break;
  case 7:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ",0x2d);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.
                        m_streamIndex);
    pcVar16 = 
    " do not contain channels configuration info. Applying default value: L R C BL BR SL SR";
    lVar15 = 0x56;
LAB_001945c7:
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar16,lVar15);
    std::endl<char,std::char_traits<char>>(poVar8);
    pbVar13 = &sLastMsg;
    goto LAB_00194637;
  case 8:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! Multi channels WAVE file for stream ",0x2d);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (this->super_SimplePacketizerReader).super_AbstractStreamReader.
                        m_streamIndex);
    pcVar16 = 
    " do not contain channels configuration info. Applying default value: L R C LFE BL BR SL SR";
    lVar15 = 0x5a;
    break;
  default:
    goto switchD_001944a3_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar16,lVar15);
  std::endl<char,std::char_traits<char>>(poVar8);
  sLastMsg = true;
LAB_00194637:
  *pbVar13 = true;
switchD_001944a3_default:
  buff_00 = (short *)((long)psVar4 + uVar17);
  bVar5 = true;
LAB_001943a2:
  if (bVar5) {
    if ((((char)*buff_00 == 'F') && (*(char *)((long)buff_00 + 1) == 'L')) &&
       (((char)buff_00[1] == 'L' && (*(char *)((long)buff_00 + 3) == 'R')))) {
      if ((long)end - (long)(buff_00 + 4) < *(long *)(buff_00 + 2)) {
        return -10;
      }
      buff_00 = (short *)((long)buff_00 + *(long *)(buff_00 + 2) + 8);
    }
    psVar14 = buff_00 + 0x60;
    if (end < buff_00 + 0x60) {
      psVar14 = (short *)end;
    }
    puVar11 = findSubstr("data",(uint8_t *)buff_00,(uint8_t *)psVar14);
    if (puVar11 == (uint8_t *)0x0) {
      iVar10 = -10;
      if ((uint8_t *)0xbf < end) {
        iVar10 = 0;
      }
    }
    else {
      if (this->m_headerType == htWAVE) {
        puVar12 = puVar11 + 8;
        if (end <= puVar12) {
          return -10;
        }
        uVar3 = *(uint *)(puVar11 + 4);
        this->m_curChunkLen = (ulong)uVar3;
        if ((ulong)uVar3 == 0) {
          this->m_openSizeWaveFormat = true;
        }
      }
      else {
        puVar12 = puVar11 + 0x18;
        if (end <= puVar12) {
          return -10;
        }
        this->m_curChunkLen = *(long *)(puVar11 + 0x10) + -0x18;
      }
      iVar10 = (int)puVar12 - (int)buff;
    }
  }
  return iVar10;
}

Assistant:

int LPCMStreamReader::decodeWaveHeader(uint8_t* buff, uint8_t* end)
{
    if (end - buff < 20)
        return NOT_ENOUGH_BUFFER;
    uint8_t* curPos = buff;
    // if (m_channels == 0)
    {
        WAVEFORMATPCMEX* waveFormatPCMEx;
        uint64_t fmtSize;
        if (m_headerType == LPCMHeaderType::htWAVE64)
        {
            curPos = findSubstr("fmt ", buff, end);
            if (curPos == nullptr || curPos + sizeof(GUID) + 8 >= end)
                return NOT_ENOUGH_BUFFER;
            uint8_t* tmpPos = curPos + sizeof(GUID);
            fmtSize = *reinterpret_cast<uint64_t*>(tmpPos);
            if (curPos + fmtSize >= end)
                return NOT_ENOUGH_BUFFER;
            waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(tmpPos + 8);
        }
        else
        {
            curPos = findSubstr("fmt ", buff, end);
            if (curPos == nullptr || curPos + 8 >= end)
                return NOT_ENOUGH_BUFFER;
            fmtSize = *reinterpret_cast<uint32_t*>(curPos + 4);
            if (curPos + 8 + fmtSize >= end)
                return NOT_ENOUGH_BUFFER;
            curPos += 8;
            waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(curPos);
        }

        m_channels = static_cast<uint8_t>(waveFormatPCMEx->nChannels);
        if (m_channels > 8)
            THROW(ERR_COMMON,
                  "Too many channels: " << static_cast<int>(m_channels) << ". Maximum supported value is 8(7.1)")
        if (m_channels == 0)
            THROW(ERR_COMMON, "Invalid channels count: 0. WAVE header is invalid.")
        m_freq = waveFormatPCMEx->nSamplesPerSec;
        if (m_freq != 48000 && m_freq != 96000 && m_freq != 192000)
            THROW(ERR_COMMON,
                  "Sample rate " << m_freq << " is not supported for LPCM format. Allowed values: 48000, 96000, 192000")
        m_bitsPerSample = waveFormatPCMEx->wBitsPerSample;
        if (m_bitsPerSample != 16 && m_bitsPerSample != 20 && m_bitsPerSample != 24)
            THROW(ERR_COMMON, "Bit depth " << m_bitsPerSample
                                           << " is not supported for LPCM format. Allowed values: 16bit, 20bit, 24bit")
        m_lfeExists = false;
        if (waveFormatPCMEx->wFormatTag == WAVE_FORMAT_EXTENSIBLE)
        {
            if (waveFormatPCMEx->Samples.wValidBitsPerSample)
                m_bitsPerSample = waveFormatPCMEx->Samples.wValidBitsPerSample;
            m_lfeExists = waveFormatPCMEx->dwChannelMask & SPEAKER_LOW_FREQUENCY;
            if (!(waveFormatPCMEx->SubFormat == KSDATAFORMAT_SUBTYPE_PCM))
                THROW(ERR_COMMON, "Unsupported WAVE format. Only PCM audio is supported.")
        }
        else if (waveFormatPCMEx->wFormatTag == 0x01)
        {  // standard format
            if (m_channels > 2)
            {
                if (m_channels == 3)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R LFE");
                    m_lfeExists = true;
                }
                else if (m_channels == 4)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R BL BR");
                }
                else if (m_channels == 5)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C BL BR");
                }
                else if (m_channels == 6)
                {
                    LTRACE(
                        LT_WARN, 2,
                        "Warning! Multi channels WAVE file for stream "
                            << m_streamIndex
                            << " do not contain channels configuration info. Applying default value: L R C LFE BL BR");
                    m_lfeExists = true;
                }
                else if (m_channels == 7)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C BL BR SL "
                                  "SR");
                }
                else if (m_channels == 8)
                {
                    LTRACE(LT_WARN, 2,
                           "Warning! Multi channels WAVE file for stream "
                               << m_streamIndex
                               << " do not contain channels configuration info. Applying default value: L R C LFE BL "
                                  "BR SL SR");
                    m_lfeExists = true;
                }
            }
        }
        else
            THROW(ERR_COMMON, "Unsupported WAVE format. wFormatTag: " << waveFormatPCMEx->wFormatTag)
        curPos += fmtSize;
    }

    // in case there is a 'FLLR' (IPhone filler), skip it
    if (curPos[0] == 'F' && curPos[1] == 'L' && curPos[2] == 'L' && curPos[3] == 'R')
    {
        curPos += 4;
        int64_t fllrSize = *reinterpret_cast<int64_t*>(curPos);
        curPos += 4;
        if (end - curPos < fllrSize)
            return NOT_ENOUGH_BUFFER;
        curPos += fllrSize;
    }

    curPos = findSubstr("data", curPos, FFMIN(curPos + MAX_HEADER_SIZE, end));
    if (curPos == nullptr)
    {
        return end < curPos + MAX_HEADER_SIZE ? NOT_ENOUGH_BUFFER : 0;
        // 'riff' header was wrong detected, it is just data
    }

    if (m_headerType == LPCMHeaderType::htWAVE)
    {
        if (curPos + 8 >= end)
            return NOT_ENOUGH_BUFFER;
        curPos += 4;  // skip 'data' identifier
        m_curChunkLen = *reinterpret_cast<uint32_t*>(curPos);
        if (m_curChunkLen == 0)
            m_openSizeWaveFormat = true;
        curPos += 4;
    }
    else
    {
        if (curPos + sizeof(GUID) + 8 >= end)
            return NOT_ENOUGH_BUFFER;
        curPos += sizeof(GUID);
        // For w64, data length includes data metadata (16 bytes) and size (8 bytes)
        m_curChunkLen = *reinterpret_cast<int64_t*>(curPos) - 24;
        curPos += 8;
    }
    return static_cast<int>(curPos - buff);
}